

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O3

REF_STATUS
ref_metric_cons_euler_g
          (REF_DBL *g,REF_GRID ref_grid,REF_INT ldim,REF_DBL *prim_dual,
          REF_RECON_RECONSTRUCTION reconstruction)

{
  double dVar1;
  REF_NODE pRVar2;
  REF_GLOB *pRVar3;
  uint uVar4;
  REF_DBL *scalar;
  REF_DBL *grad;
  long lVar5;
  double *pdVar6;
  REF_DBL *pRVar7;
  undefined8 uVar8;
  REF_DBL *pRVar9;
  long lVar10;
  ulong uVar11;
  char *pcVar12;
  long lVar13;
  REF_STATUS RVar14;
  ulong uVar15;
  REF_DBL state [5];
  REF_DBL dflux_dcons [25];
  long local_180;
  double *local_178;
  REF_DBL local_148 [4];
  REF_DBL local_128;
  REF_DBL RStack_120;
  REF_DBL local_118;
  REF_DBL RStack_110;
  REF_DBL local_108;
  double local_f8 [25];
  
  pRVar2 = ref_grid->node;
  uVar4 = pRVar2->max;
  uVar15 = (ulong)uVar4;
  if ((int)uVar4 < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",0xb8c,
           "ref_metric_cons_euler_g","malloc lam of REF_DBL negative");
    RVar14 = 1;
  }
  else {
    scalar = (REF_DBL *)malloc(uVar15 * 8);
    if (scalar == (REF_DBL *)0x0) {
      pcVar12 = "malloc lam of REF_DBL NULL";
      uVar8 = 0xb8c;
    }
    else {
      if (uVar4 != 0) {
        memset(scalar,0,uVar15 * 8);
      }
      grad = (REF_DBL *)malloc(uVar15 * 0x18);
      if (grad != (REF_DBL *)0x0) {
        if (uVar4 != 0) {
          memset(grad,0,(uVar15 * 3 & 0xffffffff) << 3);
        }
        pRVar9 = prim_dual + ldim / 2;
        local_178 = local_f8;
        local_180 = 0;
        while( true ) {
          if (0 < (int)uVar15) {
            pRVar3 = pRVar2->global;
            uVar11 = 0;
            pRVar7 = pRVar9;
            do {
              if (-1 < pRVar3[uVar11]) {
                scalar[uVar11] = *pRVar7;
              }
              uVar11 = uVar11 + 1;
              pRVar7 = pRVar7 + ldim;
            } while (uVar15 != uVar11);
          }
          uVar4 = ref_recon_gradient(ref_grid,scalar,grad,reconstruction);
          if (uVar4 != 0) break;
          uVar15 = (ulong)(uint)pRVar2->max;
          lVar13 = 0;
          do {
            if (0 < (int)uVar15) {
              uVar11 = 0;
              lVar10 = 0;
              do {
                if (-1 < pRVar2->global[lVar10]) {
                  lVar5 = (long)((int)lVar10 * ldim);
                  local_148[0] = 0.0;
                  local_148[1] = 0.0;
                  local_148[2] = 0.0;
                  local_148[lVar13] = 1.0;
                  local_128 = prim_dual[lVar5];
                  RStack_120 = (prim_dual + lVar5)[1];
                  local_118 = prim_dual[lVar5 + 2];
                  RStack_110 = (prim_dual + lVar5 + 2)[1];
                  local_108 = prim_dual[lVar5 + 4];
                  uVar4 = ref_phys_euler_jac(&local_128,local_148,local_f8);
                  if (uVar4 != 0) {
                    pcVar12 = "euler";
                    uVar8 = 0xb9e;
                    goto LAB_00177464;
                  }
                  dVar1 = grad[lVar13 + lVar10 * 3];
                  lVar5 = 0;
                  pdVar6 = local_178;
                  do {
                    g[uVar11 + lVar5] = *pdVar6 * dVar1 + g[uVar11 + lVar5];
                    lVar5 = lVar5 + 1;
                    pdVar6 = pdVar6 + 5;
                  } while (lVar5 != 5);
                  uVar15 = (ulong)(uint)pRVar2->max;
                }
                lVar10 = lVar10 + 1;
                uVar11 = (ulong)((int)uVar11 + 5);
              } while (lVar10 < (int)uVar15);
            }
            lVar13 = lVar13 + 1;
          } while (lVar13 != 3);
          local_180 = local_180 + 1;
          pRVar9 = pRVar9 + 1;
          local_178 = local_178 + 1;
          if (local_180 == 5) {
            free(grad);
            free(scalar);
            return 0;
          }
        }
        pcVar12 = "grad_lam";
        uVar8 = 0xb94;
LAB_00177464:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               uVar8,"ref_metric_cons_euler_g",(ulong)uVar4,pcVar12);
        return uVar4;
      }
      pcVar12 = "malloc grad_lam of REF_DBL NULL";
      uVar8 = 0xb8d;
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",uVar8,
           "ref_metric_cons_euler_g",pcVar12);
    RVar14 = 2;
  }
  return RVar14;
}

Assistant:

REF_FCN REF_STATUS ref_metric_cons_euler_g(
    REF_DBL *g, REF_GRID ref_grid, REF_INT ldim, REF_DBL *prim_dual,
    REF_RECON_RECONSTRUCTION reconstruction) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT var, dir, node, i;
  REF_INT nequ;
  REF_DBL state[5], dflux_dcons[25], direction[3];
  REF_DBL *lam, *grad_lam;
  REF_BOOL debug_export = REF_FALSE;

  nequ = ldim / 2;

  ref_malloc_init(lam, ref_node_max(ref_node), REF_DBL, 0.0);
  ref_malloc_init(grad_lam, 3 * ref_node_max(ref_node), REF_DBL, 0.0);

  for (var = 0; var < 5; var++) {
    each_ref_node_valid_node(ref_node, node) {
      lam[node] = prim_dual[var + 1 * nequ + ldim * node];
    }
    RSS(ref_recon_gradient(ref_grid, lam, grad_lam, reconstruction),
        "grad_lam");
    for (dir = 0; dir < 3; dir++) {
      each_ref_node_valid_node(ref_node, node) {
        direction[0] = 0.0;
        direction[1] = 0.0;
        direction[2] = 0.0;
        direction[dir] = 1.0;
        for (i = 0; i < 5; i++) {
          state[i] = prim_dual[i + 0 * nequ + ldim * node];
        }
        RSS(ref_phys_euler_jac(state, direction, dflux_dcons), "euler");
        for (i = 0; i < 5; i++) {
          g[i + 5 * node] +=
              dflux_dcons[var + i * 5] * grad_lam[dir + 3 * node];
        }
      }
    }

    if (debug_export) {
      char filename[32];
      snprintf(filename, 32, "gradlam%d.tec", var);
      ref_gather_scalar_by_extension(ref_grid, 3, grad_lam, NULL, filename);
    }
  }
  ref_free(grad_lam);
  ref_free(lam);

  if (debug_export) {
    RSS(ref_gather_scalar_by_extension(ref_grid, 5, g, NULL, "g.tec"),
        "dump g");
  }

  return REF_SUCCESS;
}